

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask8_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 8 | *out;
  *out = in[2] << 0x10 | *out;
  *out = in[3] << 0x18 | *out;
  puVar1 = out + 1;
  *puVar1 = in[4];
  *puVar1 = in[5] << 8 | *puVar1;
  *puVar1 = in[6] << 0x10 | *puVar1;
  *puVar1 = in[7] << 0x18 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[8];
  *puVar1 = in[9] << 8 | *puVar1;
  *puVar1 = in[10] << 0x10 | *puVar1;
  *puVar1 = in[0xb] << 0x18 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[0xc];
  *puVar1 = in[0xd] << 8 | *puVar1;
  *puVar1 = in[0xe] << 0x10 | *puVar1;
  *puVar1 = in[0xf] << 0x18 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask8_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;

  return out;
}